

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRandomBernoulliLikeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  string *__rhs;
  float fVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string err;
  RandomBernoulliLikeLayerParams *params;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    Result::~Result(__return_storage_ptr__);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      Result::~Result(__return_storage_ptr__);
      err.field_2._8_8_ = Specification::NeuralNetworkLayer::randombernoullilike(layer);
      fVar2 = Specification::RandomBernoulliLikeLayerParams::prob
                        ((RandomBernoulliLikeLayerParams *)err.field_2._8_8_);
      if ((fVar2 < 0.0) ||
         (fVar2 = Specification::RandomBernoulliLikeLayerParams::prob
                            ((RandomBernoulliLikeLayerParams *)err.field_2._8_8_), 1.0 < fVar2)) {
        __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
        std::operator+(&local_88,"Value of prob should be in range [0: 1] for \'",__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,&local_88,"\' layer.");
        std::__cxx11::string::~string((string *)&local_88);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_68);
        std::__cxx11::string::~string((string *)local_68);
      }
      else {
        Result::Result(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRandomBernoulliLikeLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.randombernoullilike();
    if (params.prob() < 0.0f || params.prob() > 1.0f) {
        const std::string err = "Value of prob should be in range [0: 1] for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}